

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupDestinationRecord.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::GroupDestinationRecord::IsGroupBitSet(GroupDestinationRecord *this,KUINT8 Group)

{
  bool bVar1;
  KException *this_00;
  allocator<char> local_39;
  bitset<32UL> bits;
  
  if (Group < 0x20) {
    bits.super__Base_bitset<1UL>._M_w._4_4_ = 0;
    bits.super__Base_bitset<1UL>._M_w._0_4_ = this->m_ui32GrpBtField;
    bVar1 = std::bitset<32UL>::test(&bits,(ulong)Group);
    return bVar1;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&bits,"IsGroupBitSet",&local_39);
  KException::KException(this_00,(KString *)&bits,7);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

KBOOL GroupDestinationRecord::IsGroupBitSet(KUINT8 Group) const noexcept(false)
{
    if( Group > 31 )throw KException( __FUNCTION__, OUT_OF_BOUNDS );

    const bitset<32> bits( ( KINT32 )m_ui32GrpBtField ); // We need to cast to a signed int, this is a visual studio 2010 fix
    return bits.test( Group );
}